

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeGeneric.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintThreeGeneric::SetVariables
          (ChConstraintThreeGeneric *this,ChVariables *mvariables_a,ChVariables *mvariables_b,
          ChVariables *mvariables_c)

{
  int iVar1;
  
  if ((mvariables_b == (ChVariables *)0x0 || mvariables_a == (ChVariables *)0x0) ||
      mvariables_c == (ChVariables *)0x0) {
    (this->super_ChConstraintThree).super_ChConstraint.valid = false;
    ChConstraint::UpdateActiveFlag((ChConstraint *)this);
    return;
  }
  (this->super_ChConstraintThree).super_ChConstraint.valid = true;
  ChConstraint::UpdateActiveFlag((ChConstraint *)this);
  (this->super_ChConstraintThree).variables_a = mvariables_a;
  (this->super_ChConstraintThree).variables_b = mvariables_b;
  (this->super_ChConstraintThree).variables_c = mvariables_c;
  iVar1 = (*mvariables_a->_vptr_ChVariables[2])(mvariables_a);
  if (0 < iVar1) {
    iVar1 = (*((this->super_ChConstraintThree).variables_a)->_vptr_ChVariables[2])();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
              (&(this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,
               (long)iVar1);
    iVar1 = (*((this->super_ChConstraintThree).variables_a)->_vptr_ChVariables[2])();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->Eq_a).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)iVar1);
    Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&this->Cq_a);
  }
  iVar1 = (*((this->super_ChConstraintThree).variables_b)->_vptr_ChVariables[2])();
  if (0 < iVar1) {
    iVar1 = (*((this->super_ChConstraintThree).variables_b)->_vptr_ChVariables[2])();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
              (&(this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,
               (long)iVar1);
    iVar1 = (*((this->super_ChConstraintThree).variables_b)->_vptr_ChVariables[2])();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->Eq_b).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)iVar1);
    Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&this->Cq_b);
  }
  iVar1 = (*((this->super_ChConstraintThree).variables_c)->_vptr_ChVariables[2])();
  if (0 < iVar1) {
    iVar1 = (*((this->super_ChConstraintThree).variables_c)->_vptr_ChVariables[2])();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
              (&(this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,
               (long)iVar1);
    iVar1 = (*((this->super_ChConstraintThree).variables_c)->_vptr_ChVariables[2])();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->Eq_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)iVar1);
    Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)&this->Cq_c);
    return;
  }
  return;
}

Assistant:

void ChConstraintThreeGeneric::SetVariables(ChVariables* mvariables_a,
                                            ChVariables* mvariables_b,
                                            ChVariables* mvariables_c) {
    if (!mvariables_a || !mvariables_b || !mvariables_c) {
        SetValid(false);
        return;
    }

    SetValid(true);
    variables_a = mvariables_a;
    variables_b = mvariables_b;
    variables_c = mvariables_c;

    if (variables_a->Get_ndof() > 0) {
        Cq_a.resize(variables_a->Get_ndof());
        Eq_a.resize(variables_a->Get_ndof());
        Cq_a.setZero();
    }

    if (variables_b->Get_ndof() > 0) {
        Cq_b.resize(variables_b->Get_ndof());
        Eq_b.resize(variables_b->Get_ndof());
        Cq_b.setZero();
    }

    if (variables_c->Get_ndof() > 0) {
        Cq_c.resize(variables_c->Get_ndof());
        Eq_c.resize(variables_c->Get_ndof());
        Cq_c.setZero();
    }
}